

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

ModelPtr __thiscall libcellml::Importer::flattenModel(Importer *this,ModelPtr *model)

{
  pointer *ppuVar1;
  IssueImpl *pIVar2;
  bool bVar3;
  LoggerImpl *pLVar4;
  ImporterImpl *this_00;
  UnitsPtr *pUVar5;
  size_t sVar6;
  int in_ECX;
  ModelPtr *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  void *__child_stack;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  ComponentPtr *in_R8;
  size_t index;
  UnitsPtr *units;
  ulong componentIndex;
  Model *__tmp;
  _Alloc_hider this_01;
  Model *pMVar8;
  ModelPtr MVar9;
  IssuePtr issue;
  UnitsPtr u;
  ComponentEntityPtr local_68;
  string local_50;
  
  pLVar4 = Logger::pFunc((Logger *)model);
  Logger::LoggerImpl::removeAllIssues(pLVar4);
  (this->super_Logger)._vptr_Logger = (_func_int **)0x0;
  (this->super_Logger).mPimpl = (LoggerImpl *)0x0;
  if ((in_RDX->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    Issue::IssueImpl::create();
    Issue::IssueImpl::setReferenceRule
              ((IssueImpl *)
               (((ComponentEntity *)
                &(local_68.
                  super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->super_NamedEntity)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,
               INVALID_ARGUMENT);
    pIVar2 = (IssueImpl *)
             (((ComponentEntity *)
              &(local_68.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_NamedEntity)->super_NamedEntity).super_ParentedEntity.super_Entity.
             mPimpl;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"The model is null.","");
    Issue::IssueImpl::setDescription(pIVar2,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pLVar4 = Logger::pFunc((Logger *)model);
    Logger::LoggerImpl::addIssue(pLVar4,(IssuePtr *)&local_68);
    _Var7._M_pi = extraout_RDX_00;
  }
  else {
    this_00 = (ImporterImpl *)Logger::pFunc((Logger *)model);
    bVar3 = ImporterImpl::hasImportIssues(this_00,in_RDX);
    _Var7._M_pi = extraout_RDX;
    if (bVar3) goto LAB_00223a88;
    bVar3 = Model::isDefined((in_RDX->
                             super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
    if (bVar3) {
      Model::clone((Model *)&local_50,
                   (__fn *)(in_RDX->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr,__child_stack,in_ECX,in_R8);
      (this->super_Logger)._vptr_Logger = (_func_int **)local_50._M_dataplus._M_p;
      (this->super_Logger).mPimpl = (LoggerImpl *)local_50._M_string_length;
      this_01._M_p = local_50._M_dataplus._M_p;
      while( true ) {
        bVar3 = Model::hasImports((Model *)this_01._M_p);
        if (!bVar3) break;
        units = (UnitsPtr *)0x0;
        while( true ) {
          pUVar5 = (UnitsPtr *)Model::unitsCount((Model *)this_01._M_p);
          if (pUVar5 <= units) break;
          Model::units((Model *)&local_50,(size_t)this_01._M_p);
          bVar3 = ImportedEntity::isImport((ImportedEntity *)(local_50._M_dataplus._M_p + 0x10));
          if (bVar3) {
            local_68.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            local_68.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            flattenUnitsImports((libcellml *)this,(ModelPtr *)&local_50,units,(size_t)&local_68,
                                in_R8);
            if ((LoggerImpl *)
                local_68.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (LoggerImpl *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_68.
                         super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          if ((LoggerImpl *)local_50._M_string_length != (LoggerImpl *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length);
          }
          units = (UnitsPtr *)
                  ((long)&(units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr + 1);
        }
        componentIndex = 0;
        this_01._M_p = (pointer)(this->super_Logger)._vptr_Logger;
        while( true ) {
          sVar6 = ComponentEntity::componentCount((ComponentEntity *)this_01._M_p);
          if (sVar6 <= componentIndex) break;
          ComponentEntity::component((ComponentEntity *)&local_50,(size_t)this_01._M_p);
          local_68.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->super_Logger).mPimpl;
          pMVar8 = (Model *)this_01._M_p;
          if ((LoggerImpl *)
              local_68.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (LoggerImpl *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ppuVar1 = &(((LoggerImpl *)
                          local_68.
                          super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->mErrors).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *(int *)ppuVar1 = *(int *)ppuVar1 + 1;
              UNLOCK();
              pMVar8 = (Model *)(this->super_Logger)._vptr_Logger;
            }
            else {
              ppuVar1 = &(((LoggerImpl *)
                          local_68.
                          super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->mErrors).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *(int *)ppuVar1 = *(int *)ppuVar1 + 1;
            }
          }
          local_68.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)this_01._M_p;
          flattenComponentImports(&local_68,(ComponentPtr *)&local_50,componentIndex);
          if ((LoggerImpl *)
              local_68.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (LoggerImpl *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_68.
                       super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((LoggerImpl *)local_50._M_string_length != (LoggerImpl *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length);
          }
          componentIndex = componentIndex + 1;
          this_01._M_p = (pointer)pMVar8;
        }
      }
      Model::linkUnits((Model *)this_01._M_p);
      _Var7._M_pi = extraout_RDX_03;
      goto LAB_00223a88;
    }
    Issue::IssueImpl::create();
    Issue::IssueImpl::setReferenceRule
              ((IssueImpl *)
               (((ComponentEntity *)
                &(local_68.
                  super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->super_NamedEntity)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,
               IMPORTER_UNDEFINED_MODEL);
    pIVar2 = (IssueImpl *)
             (((ComponentEntity *)
              &(local_68.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_NamedEntity)->super_NamedEntity).super_ParentedEntity.super_Entity.
             mPimpl;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"The model is not fully defined.","");
    Issue::IssueImpl::setDescription(pIVar2,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pLVar4 = Logger::pFunc((Logger *)model);
    Logger::LoggerImpl::addIssue(pLVar4,(IssuePtr *)&local_68);
    _Var7._M_pi = extraout_RDX_01;
  }
  if ((LoggerImpl *)
      local_68.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (LoggerImpl *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var7._M_pi = extraout_RDX_02;
  }
LAB_00223a88:
  MVar9.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  MVar9.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModelPtr)MVar9.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModelPtr Importer::flattenModel(const ModelPtr &model)
{
    pFunc()->removeAllIssues();
    ModelPtr flatModel;
    if (model == nullptr) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::INVALID_ARGUMENT);
        issue->mPimpl->setDescription("The model is null.");
        pFunc()->addIssue(issue);

        return flatModel;
    }

    if (pFunc()->hasImportIssues(model)) {
        return flatModel;
    }

    if (!model->isDefined()) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_UNDEFINED_MODEL);
        issue->mPimpl->setDescription("The model is not fully defined.");
        pFunc()->addIssue(issue);

        return flatModel;
    }

    flatModel = model->clone();

    while (flatModel->hasImports()) {
        // Go through Units and instantiate any imported Units.
        for (size_t index = 0; index < flatModel->unitsCount(); ++index) {
            auto u = flatModel->units(index);
            if (u->isImport()) {
                flattenUnitsImports(flatModel, u, index, nullptr);
            }
        }

        // Go through Components and instantiate any imported Components.
        for (size_t index = 0; index < flatModel->componentCount(); ++index) {
            auto c = flatModel->component(index);
            flattenComponentImports(flatModel, c, index);
        }
    }

    flatModel->linkUnits();

    return flatModel;
}